

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgram.cpp
# Opt level: O1

int __thiscall zmq::dgram_t::xrecv(dgram_t *this,msg_t *msg_)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)msg_;
  iVar1 = msg_t::close(msg_,(int)msg_);
  __buf = extraout_RDX;
  if (iVar1 != 0) {
    xrecv();
    __buf = extraout_RDX_00;
  }
  if ((this->_pipe != (pipe_t *)0x0) &&
     (ctx = (EVP_PKEY_CTX *)msg_, sVar2 = pipe_t::read(this->_pipe,(int)msg_,__buf,in_RCX),
     (char)sVar2 != '\0')) {
    this->_last_in = this->_pipe;
    return 0;
  }
  iVar1 = msg_t::init(msg_,ctx);
  if (iVar1 != 0) {
    xrecv();
  }
  piVar3 = __errno_location();
  *piVar3 = 0xb;
  return -1;
}

Assistant:

int zmq::dgram_t::xrecv (msg_t *msg_)
{
    //  Deallocate old content of the message.
    int rc = msg_->close ();
    errno_assert (rc == 0);

    if (!_pipe || !_pipe->read (msg_)) {
        //  Initialise the output parameter to be a 0-byte message.
        rc = msg_->init ();
        errno_assert (rc == 0);

        errno = EAGAIN;
        return -1;
    }
    _last_in = _pipe;

    return 0;
}